

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O2

void __thiscall Js::JavascriptMap::SetOnComplexVarMap(JavascriptMap *this,Var key,Var value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *recycler;
  undefined1 local_78 [8];
  MapDataKeyValuePair pair;
  WriteBarrierPtr<void> local_60;
  WriteBarrierPtr<void> local_58;
  WriteBarrierPtr<void> local_50;
  MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
  *local_48;
  MapDataNode *newNode;
  MapDataNode *node;
  Var key_local;
  
  node = (MapDataNode *)key;
  if (this->kind != ComplexVarMap) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x232,"(this->kind == MapKind::ComplexVarMap)",
                                "this->kind == MapKind::ComplexVarMap");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  newNode = (MapDataNode *)0x0;
  bVar2 = JsUtil::
          BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<void*>
                    ((BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->u,&node,&newNode);
  if (bVar2) {
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&pair.value,node);
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&local_60,value);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::
    KeyValuePair((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
                 local_78,&pair.value,&local_60);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::operator=
              (&newNode->data,
               (KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
               local_78);
  }
  else {
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&local_58,node);
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&local_50,value);
    JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::
    KeyValuePair((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
                 local_78,&local_58,&local_50);
    recycler = RecyclableObject::GetRecycler((RecyclableObject *)this);
    local_48 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
               ::Append(&this->list,
                        (KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>
                         *)local_78,recycler);
    JsUtil::
    BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<void*,Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>>>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this->u,&node,&local_48);
  }
  return;
}

Assistant:

void
JavascriptMap::SetOnComplexVarMap(Var key, Var value)
{
    Assert(this->kind == MapKind::ComplexVarMap);

    MapDataNode* node = nullptr;
    if (this->u.complexVarMap->TryGetValue(key, &node))
    {
        node->data = MapDataKeyValuePair(key, value);
        return;
    }

    MapDataKeyValuePair pair(key, value);
    MapDataNode* newNode = this->list.Append(pair, this->GetRecycler());
    this->u.complexVarMap->Add(key, newNode);
}